

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall
Bech32Test_reject_mixedcase_data_Test::~Bech32Test_reject_mixedcase_data_Test
          (Bech32Test_reject_mixedcase_data_Test *this)

{
  Bech32Test_reject_mixedcase_data_Test *this_local;
  
  ~Bech32Test_reject_mixedcase_data_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, reject_mixedcase_data) {
    std::string data("abcdEfghi");
    EXPECT_THROW(rejectBStringMixedCase(data), std::runtime_error);

    data = "ABCDeFGHI";
    EXPECT_THROW(rejectBStringMixedCase(data), std::runtime_error);

    data = "abcde123FGHI";
    EXPECT_THROW(rejectBStringMixedCase(data), std::runtime_error);
}